

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Sphere::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Sphere *this,Ray *r,
          Float tMax)

{
  Float FVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Interval i;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Interval i_00;
  Interval args;
  Interval i_01;
  Interval args_1;
  undefined8 uVar10;
  Sphere *pSVar11;
  undefined1 auVar12 [16];
  Interval IVar14;
  Interval i_02;
  type tVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Interval b;
  Vector3fi di;
  Point3fi oi;
  Interval c;
  Point3fi fp;
  Tuple3<pbrt::Point3,_float> local_168;
  undefined1 local_158 [16];
  Interval local_140;
  Point3fi local_138;
  Point3fi local_118;
  undefined1 local_f8 [16];
  Interval local_e0;
  Interval local_d8;
  Sphere *local_c0;
  Vector3<pbrt::Interval> local_b8;
  Interval local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Point3fi local_70;
  undefined1 local_58 [16];
  Interval local_40;
  Interval local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  
  local_168.x = 0.0;
  local_168.y = 0.0;
  local_168.z = 0.0;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = __return_storage_ptr__;
  auVar33._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = auVar33._0_4_;
  auVar12._0_4_ = auVar33._0_4_;
  auVar12._8_4_ = auVar33._0_4_;
  auVar12._12_4_ = auVar33._0_4_;
  auVar33._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar31._4_4_ = auVar33._0_4_;
  auVar31._0_4_ = auVar33._0_4_;
  auVar31._8_4_ = auVar33._0_4_;
  auVar31._12_4_ = auVar33._0_4_;
  auVar33._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar35._4_4_ = auVar33._0_4_;
  auVar35._0_4_ = auVar33._0_4_;
  auVar35._8_4_ = auVar33._0_4_;
  auVar35._12_4_ = auVar33._0_4_;
  local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar12,auVar31);
  local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar35);
  local_c0 = this;
  Transform::operator()(&local_118,this->objectFromRender,&local_138);
  auVar33._0_4_ = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar15._4_4_ = auVar33._0_4_;
  auVar15._0_4_ = auVar33._0_4_;
  auVar15._8_4_ = auVar33._0_4_;
  auVar15._12_4_ = auVar33._0_4_;
  auVar33._0_4_ = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar32._4_4_ = auVar33._0_4_;
  auVar32._0_4_ = auVar33._0_4_;
  auVar32._8_4_ = auVar33._0_4_;
  auVar32._12_4_ = auVar33._0_4_;
  auVar33._0_4_ = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._4_4_ = auVar33._0_4_;
  auVar36._0_4_ = auVar33._0_4_;
  auVar36._8_4_ = auVar33._0_4_;
  auVar36._12_4_ = auVar33._0_4_;
  local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar15,auVar32);
  local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar36);
  Transform::operator()((Vector3fi *)&local_138,this->objectFromRender,(Vector3fi *)&local_70);
  IVar14 = SumSquares<pbrt::Interval,pbrt::Interval>
                     (local_138.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x,
                      local_138.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,
                      local_138.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z);
  local_158._8_8_ = extraout_XMM0_Qb;
  local_158._0_4_ = IVar14.low;
  local_158._4_4_ = IVar14.high;
  IVar14.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
  IVar14.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
  auVar18._0_8_ = Interval::operator*((Interval *)&local_138,IVar14);
  auVar18._8_56_ = extraout_var_01;
  local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar18._0_16_);
  i_00.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
  i_00.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
  ;
  IVar14 = Interval::operator*(&local_138.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i_00);
  auVar19._0_8_ = Interval::operator+((Interval *)&local_b8,IVar14);
  auVar19._8_56_ = extraout_var_02;
  IVar14 = (Interval)vmovlps_avx(auVar19._0_16_);
  i_01.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high;
  i_01.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
  ;
  local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar14;
  IVar14 = Interval::operator*(&local_138.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z,i_01);
  IVar14 = Interval::operator+((Interval *)&local_70,IVar14);
  auVar20._0_8_ = pbrt::operator*(2.0,IVar14);
  auVar20._8_56_ = extraout_var_03;
  args.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
  args.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
  ;
  args_1.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                high;
  args_1.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               low;
  local_140 = (Interval)vmovlps_avx(auVar20._0_16_);
  i.high = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  i.low = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar21._0_8_ = SumSquares<pbrt::Interval,pbrt::Interval>(i,args,args_1);
  pSVar11 = local_c0;
  auVar21._8_56_ = extraout_var_04;
  local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar21._0_16_);
  i_02.high = local_c0->radius;
  i_02.low = local_c0->radius;
  IVar14 = Sqr(i_02);
  auVar22._0_8_ = Interval::operator-((Interval *)&local_70,IVar14);
  auVar22._8_56_ = extraout_var_05;
  local_a0 = (Interval)vmovlps_avx(auVar22._0_16_);
  IVar14 = pbrt::operator*(2.0,(Interval)local_158._0_8_);
  IVar14 = Interval::operator/(&local_140,IVar14);
  Tuple3<pbrt::Vector3,pbrt::Interval>::operator*
            (&local_b8,(Tuple3<pbrt::Vector3,pbrt::Interval> *)&local_138,IVar14);
  Point3fi::operator-(&local_70,&local_118,&local_b8);
  auVar23._0_8_ =
       Sqr(local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  auVar23._8_56_ = extraout_var_06;
  local_e0 = (Interval)vmovlps_avx(auVar23._0_16_);
  IVar14 = Sqr(local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  auVar24._0_8_ = Interval::operator+(&local_e0,IVar14);
  auVar24._8_56_ = extraout_var_07;
  local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar24._0_16_);
  IVar14 = Sqr(local_70.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z);
  IVar14 = Interval::operator+((Interval *)&local_b8,IVar14);
  local_d8 = Sqrt(IVar14);
  auVar25._0_8_ = pbrt::operator*(4.0,(Interval)local_158._0_8_);
  auVar25._8_56_ = extraout_var_08;
  local_e0 = (Interval)vmovlps_avx(auVar25._0_16_);
  local_38.low = pSVar11->radius;
  local_38.high = local_38.low;
  IVar14 = Interval::operator+(&local_38,local_d8);
  auVar26._0_8_ = Interval::operator*(&local_e0,IVar14);
  auVar26._8_56_ = extraout_var_09;
  local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar26._0_16_);
  local_40.low = pSVar11->radius;
  local_40.high = local_40.low;
  IVar14 = Interval::operator-(&local_40,local_d8);
  IVar14 = Interval::operator*((Interval *)&local_b8,IVar14);
  uVar10 = local_f8._0_8_;
  if (0.0 <= IVar14.low) {
    IVar14 = Sqrt(IVar14);
    if (0.0 <= (local_140.low + local_140.high) * 0.5) {
      IVar14 = Interval::operator+(&local_140,IVar14);
    }
    else {
      IVar14 = Interval::operator-(&local_140,IVar14);
    }
    auVar27._0_8_ = pbrt::operator*(-0.5,IVar14);
    auVar27._8_56_ = extraout_var_10;
    local_e0 = (Interval)vmovlps_avx(auVar27._0_16_);
    IVar14 = Interval::operator/(&local_e0,(Interval)local_158._0_8_);
    local_158._8_8_ = extraout_XMM0_Qb_00;
    local_158._0_4_ = IVar14.low;
    local_158._4_4_ = IVar14.high;
    auVar28._0_8_ = Interval::operator/(&local_a0,local_e0);
    auVar28._8_56_ = extraout_var_11;
    auVar12 = auVar28._0_16_;
    local_f8 = local_158;
    if (local_158._0_4_ <= auVar28._0_4_) {
      local_f8 = auVar12;
      auVar12 = local_158;
    }
    local_58 = vmovshdup_avx(auVar12);
    if (((tMax < local_58._0_4_) || (local_f8._0_4_ <= 0.0)) ||
       ((local_88 = vmovshdup_avx(local_f8), auVar12._0_4_ <= 0.0 &&
        (auVar12 = local_f8, local_58 = local_88, tMax < local_88._0_4_)))) goto LAB_0031ca99;
    auVar8._4_4_ = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar8._0_4_ = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar8._8_4_ = local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar8._12_4_ =
         local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar15 = vinsertps_avx(auVar8,ZEXT416((uint)local_118.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    auVar33._0_4_ = (auVar12._0_4_ + local_58._0_4_) * 0.5;
    auVar31 = vinsertps_avx((undefined1  [16])
                            local_138.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_138.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    local_98 = ZEXT416((uint)auVar33._0_4_);
    local_168.z = (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .z.low + local_118.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
                  auVar33._0_4_ *
                  (local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .z.low + local_138.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar16._0_4_ =
         (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar15._0_4_) * 0.5 +
         auVar33._0_4_ *
         (local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar31._0_4_) * 0.5;
    auVar16._4_4_ =
         (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar15._4_4_) * 0.5 +
         auVar33._0_4_ *
         (local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar31._4_4_) * 0.5;
    auVar16._8_4_ = (auVar15._8_4_ + 0.0) * 0.5 + auVar33._0_4_ * (auVar31._8_4_ + 0.0) * 0.5;
    auVar16._12_4_ = (auVar15._12_4_ + 0.0) * 0.5 + auVar33._0_4_ * (auVar31._12_4_ + 0.0) * 0.5;
    local_168._0_8_ = vmovlps_avx(auVar16);
    local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = 0.0;
    local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = 0.0;
    local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.low = 0.0;
    local_d8.low = pSVar11->radius;
    local_158 = auVar12;
    tVar13 = Distance<float>((Point3<float> *)&local_168,(Point3<float> *)&local_b8);
    auVar34._0_4_ = local_d8.low / tVar13;
    auVar33._0_4_ = local_168.x * auVar34._0_4_;
    auVar33._4_4_ = local_168.y * auVar34._0_4_;
    auVar33._8_4_ = auVar34._0_4_ * 0.0;
    auVar33._12_4_ = auVar34._0_4_ * 0.0;
    local_168._0_8_ = vmovlps_avx(auVar33);
    local_168.z = auVar34._0_4_ * local_168.z;
    auVar12 = vmovshdup_avx(auVar33);
    auVar34._0_4_ = auVar12._0_4_;
    if ((((auVar33._0_4_ == 0.0) && (!NAN(auVar33._0_4_))) && (auVar34._0_4_ == 0.0)) &&
       (!NAN(auVar34._0_4_))) {
      auVar33._0_4_ = pSVar11->radius * 1e-05;
      local_168.x = auVar33._0_4_;
    }
    auVar29._0_4_ = atan2f(auVar34._0_4_,auVar33._0_4_);
    auVar29._4_60_ = extraout_var;
    FVar1 = pSVar11->radius;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)FVar1),auVar6);
    if ((pSVar11->zMin <= auVar12._0_4_) || (pSVar11->zMin <= local_168.z)) {
      uVar2 = vcmpps_avx512vl(ZEXT416((uint)pSVar11->zMax),ZEXT416((uint)FVar1),1);
      uVar3 = vcmpps_avx512vl(ZEXT416((uint)pSVar11->zMax),ZEXT416((uint)local_168.z),1);
      if ((uVar2 & uVar3 & 1) == 0) {
        uVar4 = vcmpss_avx512f(auVar29._0_16_,ZEXT816(0),1);
        bVar5 = (bool)((byte)uVar4 & 1);
        auVar33._0_4_ =
             (float)((uint)bVar5 * (int)(auVar29._0_4_ + 6.2831855) +
                    (uint)!bVar5 * (int)auVar29._0_4_);
        if (auVar33._0_4_ <= pSVar11->phiMax) goto LAB_0031cb01;
      }
    }
    if (((float)local_158._0_4_ == (float)local_f8._0_4_) &&
       (!NAN((float)local_158._0_4_) && !NAN((float)local_f8._0_4_))) {
      if (((float)local_58._0_4_ == (float)local_88._0_4_) &&
         (!NAN((float)local_58._0_4_) && !NAN((float)local_88._0_4_))) goto LAB_0031ca99;
    }
    if ((float)local_88._0_4_ <= tMax) {
      local_158 = ZEXT416((uint)FVar1);
      auVar9._4_4_ = local_118.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar9._0_4_ = local_118.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar9._8_4_ = local_118.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar9._12_4_ =
           local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar12 = vinsertps_avx(auVar9,ZEXT416((uint)local_118.super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = 0.0;
      local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = 0.0;
      local_b8.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.low = 0.0;
      auVar33._0_4_ = ((float)local_f8._0_4_ + (float)local_88._0_4_) * 0.5;
      auVar15 = vinsertps_avx((undefined1  [16])
                              local_138.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                              ZEXT416((uint)local_138.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
      ;
      local_98 = ZEXT416((uint)auVar33._0_4_);
      local_168.z = (local_118.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                    local_118.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
                    auVar33._0_4_ *
                    (local_138.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                    local_138.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar17._0_4_ =
           (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar12._0_4_) * 0.5 +
           auVar33._0_4_ *
           (local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar15._0_4_) * 0.5;
      auVar17._4_4_ =
           (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
           + auVar12._4_4_) * 0.5 +
           auVar33._0_4_ *
           (local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
           + auVar15._4_4_) * 0.5;
      auVar17._8_4_ = (auVar12._8_4_ + 0.0) * 0.5 + auVar33._0_4_ * (auVar15._8_4_ + 0.0) * 0.5;
      auVar17._12_4_ = (auVar12._12_4_ + 0.0) * 0.5 + auVar33._0_4_ * (auVar15._12_4_ + 0.0) * 0.5;
      local_168._0_8_ = vmovlps_avx(auVar17);
      tVar13 = Distance<float>((Point3<float> *)&local_168,(Point3<float> *)&local_b8);
      auVar33._0_4_ = (float)local_158._0_4_ / tVar13;
      auVar34._0_4_ = local_168.x * auVar33._0_4_;
      auVar34._4_4_ = local_168.y * auVar33._0_4_;
      auVar34._8_4_ = auVar33._0_4_ * 0.0;
      auVar34._12_4_ = auVar33._0_4_ * 0.0;
      local_168._0_8_ = vmovlps_avx(auVar34);
      local_168.z = auVar33._0_4_ * local_168.z;
      auVar12 = vmovshdup_avx(auVar34);
      auVar33._0_4_ = auVar12._0_4_;
      if ((((auVar34._0_4_ == 0.0) && (!NAN(auVar34._0_4_))) && (auVar33._0_4_ == 0.0)) &&
         (!NAN(auVar33._0_4_))) {
        auVar34._0_4_ = pSVar11->radius * 1e-05;
        local_168.x = auVar34._0_4_;
      }
      auVar30._0_4_ = atan2f(auVar33._0_4_,auVar34._0_4_);
      auVar30._4_60_ = extraout_var_00;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar12 = vxorps_avx512vl(ZEXT416((uint)pSVar11->radius),auVar7);
      if ((pSVar11->zMin <= auVar12._0_4_) || (pSVar11->zMin <= local_168.z)) {
        uVar2 = vcmpps_avx512vl(ZEXT416((uint)pSVar11->zMax),ZEXT416((uint)pSVar11->radius),1);
        uVar3 = vcmpps_avx512vl(ZEXT416((uint)pSVar11->zMax),ZEXT416((uint)local_168.z),1);
        if ((uVar2 & uVar3 & 1) == 0) {
          uVar4 = vcmpss_avx512f(auVar30._0_16_,ZEXT816(0),1);
          bVar5 = (bool)((byte)uVar4 & 1);
          auVar33._0_4_ =
               (float)((uint)bVar5 * (int)(auVar30._0_4_ + 6.2831855) +
                      (uint)!bVar5 * (int)auVar30._0_4_);
          if (auVar33._0_4_ <= pSVar11->phiMax) {
LAB_0031cb01:
            *(bool *)(uVar10 + 0x14) = true;
            ((aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
              *)uVar10)->__align = (anon_struct_4_0_00000001_for___align)local_98._0_4_;
            *(undefined8 *)
             ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                     *)uVar10 + 4) = local_168._0_8_;
            *(float *)((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                              *)uVar10 + 0xc) = local_168.z;
            *(float *)((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                              *)uVar10 + 0x10) = auVar33._0_4_;
            return (optional<pbrt::QuadricIntersection> *)uVar10;
          }
        }
      }
    }
  }
LAB_0031ca99:
  *(undefined8 *)
   ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
           *)uVar10 + 0x10) = 0;
  *(undefined8 *)
   (aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)> *)
   uVar10 = 0;
  *(undefined8 *)
   ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
           *)uVar10 + 8) = 0;
  return (optional<pbrt::QuadricIntersection> *)uVar10;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to compute sphere _t0_ and _t1_
        Interval t0, t1;
        // Compute sphere quadratic coefficients
        Interval a = SumSquares(di.x, di.y, di.z);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y + di.z * oi.z);
        Interval c = SumSquares(oi.x, oi.y, oi.z) - Sqr(Interval(radius));

        // Compute sphere quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Point3fi fp = oi - f * di;
        Interval sqrtf = Sqrt(Sqr(fp.x) + Sqr(fp.y) + Sqr(fp.z));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute sphere hit position and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine sphere intersection point
        pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

        if (pHit.x == 0 && pHit.y == 0)
            pHit.x = 1e-5f * radius;
        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test sphere intersection against clipping parameters
        if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
            phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            if (t1.UpperBound() > tMax)
                return {};
            tShapeHit = t1;
            // Compute sphere hit position and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine sphere intersection point
            pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

            if (pHit.x == 0 && pHit.y == 0)
                pHit.x = 1e-5f * radius;
            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
                phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for sphere intersection
        return QuadricIntersection{Float(tShapeHit), pHit, phi};
    }